

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  int iVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JDIMENSION num_cols;
  int nc;
  int ci;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  iVar1 = cinfo->num_components;
  uVar2 = cinfo->image_width;
  num_rows_local = num_rows;
  output_row_local = output_row;
  input_buf_local = input_buf;
  while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
    for (ci = 0; ci < iVar1; ci = ci + 1) {
      inptr = *input_buf_local;
      pJVar3 = output_buf[ci][output_row_local];
      for (col = 0; col < uVar2; col = col + 1) {
        pJVar3[col] = inptr[ci];
        inptr = inptr + iVar1;
      }
    }
    input_buf_local = input_buf_local + 1;
    output_row_local = output_row_local + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_compress_ptr cinfo,
	      JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
	      JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    /* It seems fastest to make a separate pass for each component. */
    for (ci = 0; ci < nc; ci++) {
      inptr = *input_buf;
      outptr = output_buf[ci][output_row];
      for (col = 0; col < num_cols; col++) {
	outptr[col] = inptr[ci]; /* don't need GETJSAMPLE() here */
	inptr += nc;
      }
    }
    input_buf++;
    output_row++;
  }
}